

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ColumnBinding>
          (Serializer *this,vector<duckdb::ColumnBinding,_true> *vec)

{
  pointer pCVar1;
  ColumnBinding *item;
  pointer value;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>)
                        .
                        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>)
                        .
                        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
  pCVar1 = (vec->super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
           super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (value = (vec->super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
               super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
               _M_impl.super__Vector_impl_data._M_start; value != pCVar1; value = value + 1) {
    WriteValue<duckdb::ColumnBinding>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}